

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

ImGuiTableSortSpecs * ImGui::TableGetSortSpecs(void)

{
  ImGuiTable *table_00;
  ImGuiTable *table;
  ImGuiContext *g;
  
  table_00 = GImGui->CurrentTable;
  if (table_00 != (ImGuiTable *)0x0) {
    if ((table_00->Flags & 8U) == 0) {
      g = (ImGuiContext *)0x0;
    }
    else {
      if ((table_00->IsLayoutLocked & 1U) == 0) {
        TableUpdateLayout(table_00);
      }
      TableSortSpecsBuild(table_00);
      g = (ImGuiContext *)&table_00->SortSpecs;
    }
    return (ImGuiTableSortSpecs *)g;
  }
  __assert_fail("table != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                ,0xa2b,"ImGuiTableSortSpecs *ImGui::TableGetSortSpecs()");
}

Assistant:

ImGuiTableSortSpecs* ImGui::TableGetSortSpecs()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL);

    if (!(table->Flags & ImGuiTableFlags_Sortable))
        return NULL;

    // Require layout (in case TableHeadersRow() hasn't been called) as it may alter IsSortSpecsDirty in some paths.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    TableSortSpecsBuild(table);

    return &table->SortSpecs;
}